

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::LineDirectiveSyntax>
          (DeepCloneVisitor *this,LineDirectiveSyntax *node,BumpAllocator *alloc)

{
  LineDirectiveSyntax *pLVar1;
  Token local_68;
  Token local_58;
  Token local_48;
  Token local_38;
  
  local_38 = parsing::Token::deepClone(&(node->super_DirectiveSyntax).directive,alloc);
  local_48 = parsing::Token::deepClone(&node->lineNumber,alloc);
  local_58 = parsing::Token::deepClone(&node->fileName,alloc);
  local_68 = parsing::Token::deepClone(&node->level,alloc);
  pLVar1 = BumpAllocator::
           emplace<slang::syntax::LineDirectiveSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
                     (alloc,&local_38,&local_48,&local_58,&local_68);
  return (SyntaxNode *)pLVar1;
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }